

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListExpression.cpp
# Opt level: O3

void __thiscall hdc::ListExpression::addExpression(ListExpression *this,Expression *expression)

{
  pointer *pppEVar1;
  iterator __position;
  Expression *local_18;
  
  __position._M_current =
       (this->expressions).super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_18 = expression;
  if (__position._M_current ==
      (this->expressions).super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::Expression*,std::allocator<hdc::Expression*>>::
    _M_realloc_insert<hdc::Expression*const&>
              ((vector<hdc::Expression*,std::allocator<hdc::Expression*>> *)&this->expressions,
               __position,&local_18);
  }
  else {
    *__position._M_current = expression;
    pppEVar1 = &(this->expressions).
                super__Vector_base<hdc::Expression_*,_std::allocator<hdc::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  ASTNode::setParentNode((ASTNode *)local_18,(ASTNode *)this);
  return;
}

Assistant:

void ListExpression::addExpression(Expression* expression) {
    expressions.push_back(expression);
    expression->setParentNode(this);
}